

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance.c
# Opt level: O0

uint aom_highbd_8_mse8x16_c(uint8_t *src,int src_stride,uint8_t *ref,int ref_stride,uint32_t *sse)

{
  undefined4 in_ECX;
  undefined8 in_RDX;
  undefined4 in_ESI;
  uint *in_R8;
  uint32_t *unaff_retaddr;
  int *in_stack_00000008;
  int sum;
  int in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff0;
  
  highbd_8_variance((uint8_t *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                    (int)((ulong)in_RDX >> 0x20),
                    (uint8_t *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
                    (int)((ulong)in_R8 >> 0x20),(int)in_R8,in_stack_ffffffffffffffd4,unaff_retaddr,
                    in_stack_00000008);
  return *in_R8;
}

Assistant:

void aom_highbd_comp_avg_pred_c(uint8_t *comp_pred8, const uint8_t *pred8,
                                int width, int height, const uint8_t *ref8,
                                int ref_stride) {
  int i, j;
  uint16_t *pred = CONVERT_TO_SHORTPTR(pred8);
  uint16_t *ref = CONVERT_TO_SHORTPTR(ref8);
  uint16_t *comp_pred = CONVERT_TO_SHORTPTR(comp_pred8);
  for (i = 0; i < height; ++i) {
    for (j = 0; j < width; ++j) {
      const int tmp = pred[j] + ref[j];
      comp_pred[j] = ROUND_POWER_OF_TWO(tmp, 1);
    }
    comp_pred += width;
    pred += width;
    ref += ref_stride;
  }
}